

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O1

int Test_SUNMatScaleAdd(SUNMatrix A,SUNMatrix I,int myid)

{
  uint uVar1;
  int iVar2;
  SUNMatrix A_00;
  SUNMatrix A_01;
  SUNMatrix B;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  
  A_00 = (SUNMatrix)SUNMatClone();
  uVar1 = SUNMatCopy(A,A_00);
  if (uVar1 == 0) {
    uVar1 = SUNMatScaleAdd(0xbff0000000000000,A_00,A_00);
    sync_device(A_00);
    if (uVar1 == 0) {
      iVar2 = check_matrix_entry(A_00,0.0,2.220446049250313e-15);
      if (iVar2 == 0) {
        if (print_all_ranks == 0 && myid == 0) {
LAB_001046cf:
          puts("    PASSED test -- SUNMatScaleAdd case 1 ");
        }
        else if (print_all_ranks != 0) {
          printf("process %06d: ",(ulong)(uint)myid);
          goto LAB_001046cf;
        }
        if ((myid == 0) && (print_time != 0)) {
          printf("    SUNMatScaleAdd Time: %22.15e \n \n",0);
        }
        iVar2 = is_square(A);
        iVar4 = 0;
        if (((iVar2 == 0) || (iVar2 = SUNMatGetID(A), iVar2 == 6)) ||
           (iVar2 = SUNMatGetID(A), iVar2 == 1)) goto LAB_00104636;
        A_01 = (SUNMatrix)SUNMatClone(A);
        uVar1 = SUNMatCopy(A,A_01);
        if (uVar1 == 0) {
          B = (SUNMatrix)SUNMatClone(I);
          uVar1 = SUNMatCopy(I,B);
          if (uVar1 == 0) {
            uVar1 = SUNMatScaleAdd(0x3ff0000000000000,A_01,I);
            if (uVar1 == 0) {
              uVar1 = SUNMatScaleAdd(0x3ff0000000000000,B,A);
              if (uVar1 == 0) {
                sync_device(A);
                iVar2 = check_matrix(A_01,B,2.220446049250313e-15);
                if (iVar2 == 0) {
                  if (print_all_ranks == 0 && myid == 0) {
LAB_00104909:
                    puts("    PASSED test -- SUNMatScaleAdd case 2 ");
                  }
                  else if (print_all_ranks != 0) {
                    printf("process %06d: ",(ulong)(uint)myid);
                    goto LAB_00104909;
                  }
                  if ((myid == 0) && (print_time != 0)) {
                    printf("    SUNMatScaleAdd Time: %22.15e \n \n",0);
                  }
                  SUNMatDestroy(B);
                  SUNMatDestroy(A_01);
                  goto LAB_00104636;
                }
                if (print_all_ranks == 0 && myid == 0) {
LAB_001048b9:
                  puts(">>> FAILED test -- SUNMatScaleAdd case 2 ");
                }
                else if (print_all_ranks != 0) {
                  printf("process %06d: ",(ulong)(uint)myid);
                  goto LAB_001048b9;
                }
                if (print_time != 0) {
                  printf("    SUNMatScaleAdd Time: %22.15e \n \n",0);
                }
                SUNMatDestroy(A_00);
                A_00 = B;
                goto LAB_00104861;
              }
              uVar5 = (ulong)uVar1;
              if (print_all_ranks != 0 || myid != 0) goto LAB_00104831;
            }
            else {
              uVar5 = (ulong)uVar1;
              if (print_all_ranks != 0 || myid != 0) {
LAB_00104831:
                if (print_all_ranks == 0) goto LAB_00104856;
                printf("process %06d: ",(ulong)(uint)myid);
              }
            }
            pcVar3 = ">>> FAILED test -- SUNMatScaleAdd returned %d \n";
LAB_0010484c:
            printf(pcVar3,uVar5);
          }
          else {
            uVar5 = (ulong)uVar1;
            if (print_all_ranks == 0 && myid == 0) {
LAB_001047ce:
              pcVar3 = ">>> FAILED test -- SUNMatCopy returned %d \n";
              goto LAB_0010484c;
            }
            if (print_all_ranks != 0) {
              printf("process %06d: ",(ulong)(uint)myid);
              goto LAB_001047ce;
            }
          }
LAB_00104856:
          SUNMatDestroy(A_00);
          A_00 = B;
        }
        else {
          if (print_all_ranks != 0 || myid != 0) {
            if (print_all_ranks == 0) goto LAB_00104861;
            printf("process %06d: ",(ulong)(uint)myid);
          }
          printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
        }
LAB_00104861:
        SUNMatDestroy(A_00);
        iVar4 = 1;
        A_00 = A_01;
        goto LAB_00104636;
      }
      if (print_all_ranks == 0 && myid == 0) {
LAB_00104687:
        puts(">>> FAILED test -- SUNMatScaleAdd case 1 check  ");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)(uint)myid);
        goto LAB_00104687;
      }
      iVar4 = 1;
      if (print_time != 0) {
        printf("    SUNMatScaleAdd Time: %22.15e \n \n",0);
      }
      goto LAB_00104636;
    }
    if (print_all_ranks != 0 || myid != 0) {
      if (print_all_ranks == 0) goto LAB_00104630;
      printf("process %06d: ",(ulong)(uint)myid);
    }
    pcVar3 = ">>> FAILED test -- SUNMatScaleAdd returned %d \n";
LAB_00104626:
    printf(pcVar3,(ulong)uVar1);
  }
  else {
    if (print_all_ranks == 0 && myid == 0) {
LAB_001045d3:
      pcVar3 = ">>> FAILED test -- SUNMatCopy returned %d \n";
      goto LAB_00104626;
    }
    if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)(uint)myid);
      goto LAB_001045d3;
    }
  }
LAB_00104630:
  iVar4 = 1;
LAB_00104636:
  SUNMatDestroy(A_00);
  return iVar4;
}

Assistant:

int Test_SUNMatScaleAdd(SUNMatrix A, SUNMatrix I, int myid)
{
  int failure;
  double start_time, stop_time;
  SUNMatrix B, C, D;
  sunrealtype tol = 10 * SUN_UNIT_ROUNDOFF;

  /*
   * Case 1: same sparsity/bandwith pattern
   */

  /* protect A */
  B       = SUNMatClone(A);
  failure = SUNMatCopy(A, B);
  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* fill vector data */
  start_time = get_time();
  failure    = SUNMatScaleAdd(NEG_ONE, B, B);
  sync_device(B);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatScaleAdd returned %d \n", failure,
                 myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* check matrix entries */
  failure = check_matrix_entry(B, ZERO, tol);

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatScaleAdd case 1 check  \n", myid);
    PRINT_TIME("    SUNMatScaleAdd Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatScaleAdd case 1 \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatScaleAdd Time: %22.15e \n \n", stop_time - start_time);
  }

  /*
   * Case 2: different sparsity/bandwidth patterns
   */
  if (is_square(A) && SUNMatGetID(A) != SUNMATRIX_CUSPARSE &&
      SUNMatGetID(A) != SUNMATRIX_MAGMADENSE)
  {
    /* protect A and I */
    D       = SUNMatClone(A);
    failure = SUNMatCopy(A, D);
    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
      SUNMatDestroy(B);
      SUNMatDestroy(D);
      return (1);
    }
    C       = SUNMatClone(I);
    failure = SUNMatCopy(I, C);
    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
      SUNMatDestroy(B);
      SUNMatDestroy(C);
      SUNMatDestroy(D);
      return (1);
    }

    /* fill B and C */
    start_time = get_time();
    failure    = SUNMatScaleAdd(ONE, D, I);
    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatScaleAdd returned %d \n", failure,
                   myid);
      SUNMatDestroy(B);
      SUNMatDestroy(C);
      SUNMatDestroy(D);
      return (1);
    }
    failure = SUNMatScaleAdd(ONE, C, A);
    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatScaleAdd returned %d \n", failure,
                   myid);
      SUNMatDestroy(B);
      SUNMatDestroy(C);
      SUNMatDestroy(D);
      return (1);
    }
    sync_device(A);
    stop_time = get_time();

    failure = check_matrix(D, C, tol);
    if (failure)
    {
      TEST_STATUS(">>> FAILED test -- SUNMatScaleAdd case 2 \n", myid);
      PRINT_TIME("    SUNMatScaleAdd Time: %22.15e \n \n",
                 stop_time - start_time);
      SUNMatDestroy(B);
      SUNMatDestroy(C);
      SUNMatDestroy(D);
      return (1);
    }
    else { TEST_STATUS("    PASSED test -- SUNMatScaleAdd case 2 \n", myid); }

    if (myid == 0)
    {
      PRINT_TIME("    SUNMatScaleAdd Time: %22.15e \n \n",
                 stop_time - start_time);
    }

    SUNMatDestroy(C);
    SUNMatDestroy(D);
  }

  SUNMatDestroy(B);

  return (0);
}